

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::ObjectIntersector1<true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auVar8 [32];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  byte bVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 (*pauVar19) [16];
  AABBNodeMB4D *node1;
  ulong uVar20;
  long lVar21;
  _func_int **pp_Var22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  long lVar26;
  undefined1 (*pauVar27) [16];
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 (*pauVar32) [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  int mask;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined4 local_250c;
  RayQueryContext *local_2508;
  RayHit *local_2500;
  Scene *local_24f8;
  long local_24f0;
  long local_24e8;
  RTCIntersectFunctionNArguments local_24e0;
  Geometry *local_24b0;
  undefined8 local_24a8;
  RTCIntersectArguments *local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar19 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar5 = (ray->super_RayK<1>).dir.field_0;
    auVar34 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar41._8_4_ = 0x7fffffff;
    auVar41._0_8_ = 0x7fffffff7fffffff;
    auVar41._12_4_ = 0x7fffffff;
    auVar41 = vandps_avx((undefined1  [16])aVar5,auVar41);
    auVar46._8_4_ = 0x219392ef;
    auVar46._0_8_ = 0x219392ef219392ef;
    auVar46._12_4_ = 0x219392ef;
    auVar41 = vcmpps_avx(auVar41,auVar46,1);
    auVar41 = vblendvps_avx((undefined1  [16])aVar5,auVar46,auVar41);
    fVar3 = (ray->super_RayK<1>).tfar;
    auVar37 = ZEXT464((uint)fVar3);
    auVar46 = vrcpps_avx(auVar41);
    fVar9 = auVar46._0_4_;
    auVar40._0_4_ = auVar41._0_4_ * fVar9;
    fVar10 = auVar46._4_4_;
    auVar40._4_4_ = auVar41._4_4_ * fVar10;
    fVar11 = auVar46._8_4_;
    auVar40._8_4_ = auVar41._8_4_ * fVar11;
    fVar12 = auVar46._12_4_;
    auVar40._12_4_ = auVar41._12_4_ * fVar12;
    auVar52._8_4_ = 0x3f800000;
    auVar52._0_8_ = 0x3f8000003f800000;
    auVar52._12_4_ = 0x3f800000;
    auVar41 = vsubps_avx(auVar52,auVar40);
    uVar4 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23c0._4_4_ = uVar4;
    local_23c0._0_4_ = uVar4;
    local_23c0._8_4_ = uVar4;
    local_23c0._12_4_ = uVar4;
    local_23c0._16_4_ = uVar4;
    local_23c0._20_4_ = uVar4;
    local_23c0._24_4_ = uVar4;
    local_23c0._28_4_ = uVar4;
    auVar56 = ZEXT3264(local_23c0);
    uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_23e0._4_4_ = uVar4;
    local_23e0._0_4_ = uVar4;
    local_23e0._8_4_ = uVar4;
    local_23e0._12_4_ = uVar4;
    local_23e0._16_4_ = uVar4;
    local_23e0._20_4_ = uVar4;
    local_23e0._24_4_ = uVar4;
    local_23e0._28_4_ = uVar4;
    auVar57 = ZEXT3264(local_23e0);
    uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2400._4_4_ = uVar4;
    local_2400._0_4_ = uVar4;
    local_2400._8_4_ = uVar4;
    local_2400._12_4_ = uVar4;
    local_2400._16_4_ = uVar4;
    local_2400._20_4_ = uVar4;
    local_2400._24_4_ = uVar4;
    local_2400._28_4_ = uVar4;
    auVar58 = ZEXT3264(local_2400);
    auVar47._0_4_ = fVar9 + fVar9 * auVar41._0_4_;
    auVar47._4_4_ = fVar10 + fVar10 * auVar41._4_4_;
    auVar47._8_4_ = fVar11 + fVar11 * auVar41._8_4_;
    auVar47._12_4_ = fVar12 + fVar12 * auVar41._12_4_;
    auVar41 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar3));
    auVar45 = ZEXT1664(auVar41);
    auVar46 = vshufps_avx(auVar47,auVar47,0);
    local_2420._16_16_ = auVar46;
    local_2420._0_16_ = auVar46;
    auVar59 = ZEXT3264(local_2420);
    auVar46 = vmovshdup_avx(auVar47);
    auVar54 = ZEXT1664(auVar46);
    auVar40 = vshufps_avx(auVar47,auVar47,0x55);
    local_2440._16_16_ = auVar40;
    local_2440._0_16_ = auVar40;
    auVar60 = ZEXT3264(local_2440);
    auVar40 = vshufpd_avx(auVar47,auVar47,1);
    auVar52 = vshufps_avx(auVar47,auVar47,0xaa);
    auVar51 = ZEXT1664(auVar52);
    local_2460._16_16_ = auVar52;
    local_2460._0_16_ = auVar52;
    auVar61 = ZEXT3264(local_2460);
    uVar31 = (ulong)(auVar47._0_4_ < 0.0) * 0x20;
    uVar29 = (ulong)(auVar46._0_4_ < 0.0) << 5 | 0x40;
    uVar30 = (ulong)(auVar40._0_4_ < 0.0) << 5 | 0x80;
    auVar34 = vshufps_avx(auVar34,auVar34,0);
    local_2480._16_16_ = auVar34;
    local_2480._0_16_ = auVar34;
    auVar55 = ZEXT3264(local_2480);
    auVar41 = vshufps_avx(auVar41,auVar41,0);
    auVar33 = ZEXT3264(CONCAT1616(auVar41,auVar41));
    local_2500 = ray;
    local_2508 = context;
    local_24e0.rayhit = (RTCRayHitN *)ray;
LAB_014e29f5:
    do {
      pauVar32 = pauVar19 + -1;
      pauVar19 = pauVar19 + -1;
      if (*(float *)(*pauVar32 + 8) <= auVar37._0_4_) {
        uVar25 = *(ulong *)*pauVar19;
        while ((uVar25 & 8) == 0) {
          uVar20 = uVar25 & 0xfffffffffffffff0;
          fVar3 = (((RayHit *)local_24e0.rayhit)->super_RayK<1>).dir.field_0.m128[3];
          auVar39._4_4_ = fVar3;
          auVar39._0_4_ = fVar3;
          auVar39._8_4_ = fVar3;
          auVar39._12_4_ = fVar3;
          auVar39._16_4_ = fVar3;
          auVar39._20_4_ = fVar3;
          auVar39._24_4_ = fVar3;
          auVar39._28_4_ = fVar3;
          pfVar2 = (float *)(uVar20 + 0x100 + uVar31);
          pfVar1 = (float *)(uVar20 + 0x40 + uVar31);
          auVar36._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar36._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar36._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar36._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar36._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar36._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar36._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar36._28_4_ = auVar37._28_4_ + pfVar1[7];
          auVar36 = vsubps_avx(auVar36,auVar56._0_32_);
          auVar13._4_4_ = auVar59._4_4_ * auVar36._4_4_;
          auVar13._0_4_ = auVar59._0_4_ * auVar36._0_4_;
          auVar13._8_4_ = auVar59._8_4_ * auVar36._8_4_;
          auVar13._12_4_ = auVar59._12_4_ * auVar36._12_4_;
          auVar13._16_4_ = auVar59._16_4_ * auVar36._16_4_;
          auVar13._20_4_ = auVar59._20_4_ * auVar36._20_4_;
          auVar13._24_4_ = auVar59._24_4_ * auVar36._24_4_;
          auVar13._28_4_ = auVar36._28_4_;
          auVar36 = vmaxps_avx(auVar55._0_32_,auVar13);
          pfVar2 = (float *)(uVar20 + 0x100 + uVar29);
          pfVar1 = (float *)(uVar20 + 0x40 + uVar29);
          auVar43._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar43._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar43._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar43._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar43._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar43._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar43._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar43._28_4_ = auVar45._28_4_ + pfVar1[7];
          auVar13 = vsubps_avx(auVar43,auVar57._0_32_);
          auVar8._4_4_ = auVar60._4_4_ * auVar13._4_4_;
          auVar8._0_4_ = auVar60._0_4_ * auVar13._0_4_;
          auVar8._8_4_ = auVar60._8_4_ * auVar13._8_4_;
          auVar8._12_4_ = auVar60._12_4_ * auVar13._12_4_;
          auVar8._16_4_ = auVar60._16_4_ * auVar13._16_4_;
          auVar8._20_4_ = auVar60._20_4_ * auVar13._20_4_;
          auVar8._24_4_ = auVar60._24_4_ * auVar13._24_4_;
          auVar8._28_4_ = auVar13._28_4_;
          pfVar2 = (float *)(uVar20 + 0x100 + uVar30);
          pfVar1 = (float *)(uVar20 + 0x40 + uVar30);
          auVar49._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar49._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar49._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar49._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar49._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar49._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar49._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar49._28_4_ = auVar51._28_4_ + pfVar1[7];
          auVar14 = vsubps_avx(auVar49,auVar58._0_32_);
          auVar16._4_4_ = auVar61._4_4_ * auVar14._4_4_;
          auVar16._0_4_ = auVar61._0_4_ * auVar14._0_4_;
          auVar16._8_4_ = auVar61._8_4_ * auVar14._8_4_;
          auVar16._12_4_ = auVar61._12_4_ * auVar14._12_4_;
          auVar16._16_4_ = auVar61._16_4_ * auVar14._16_4_;
          auVar16._20_4_ = auVar61._20_4_ * auVar14._20_4_;
          auVar16._24_4_ = auVar61._24_4_ * auVar14._24_4_;
          auVar16._28_4_ = auVar14._28_4_;
          auVar13 = vmaxps_avx(auVar8,auVar16);
          auVar8 = vmaxps_avx(auVar36,auVar13);
          pfVar2 = (float *)(uVar20 + 0x100 + (uVar31 ^ 0x20));
          pfVar1 = (float *)(uVar20 + 0x40 + (uVar31 ^ 0x20));
          auVar44._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar44._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar44._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar44._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar44._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar44._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar44._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar44._28_4_ = auVar13._28_4_ + pfVar1[7];
          auVar36 = vsubps_avx(auVar44,auVar56._0_32_);
          auVar17._4_4_ = auVar59._4_4_ * auVar36._4_4_;
          auVar17._0_4_ = auVar59._0_4_ * auVar36._0_4_;
          auVar17._8_4_ = auVar59._8_4_ * auVar36._8_4_;
          auVar17._12_4_ = auVar59._12_4_ * auVar36._12_4_;
          auVar17._16_4_ = auVar59._16_4_ * auVar36._16_4_;
          auVar17._20_4_ = auVar59._20_4_ * auVar36._20_4_;
          auVar17._24_4_ = auVar59._24_4_ * auVar36._24_4_;
          auVar17._28_4_ = auVar36._28_4_;
          pfVar2 = (float *)(uVar20 + 0x100 + (uVar29 ^ 0x20));
          pfVar1 = (float *)(uVar20 + 0x40 + (uVar29 ^ 0x20));
          auVar50._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar50._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar50._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar50._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar50._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar50._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar50._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar50._28_4_ = auVar14._28_4_ + pfVar1[7];
          auVar36 = vsubps_avx(auVar50,auVar57._0_32_);
          auVar14._4_4_ = auVar60._4_4_ * auVar36._4_4_;
          auVar14._0_4_ = auVar60._0_4_ * auVar36._0_4_;
          auVar14._8_4_ = auVar60._8_4_ * auVar36._8_4_;
          auVar14._12_4_ = auVar60._12_4_ * auVar36._12_4_;
          auVar14._16_4_ = auVar60._16_4_ * auVar36._16_4_;
          auVar14._20_4_ = auVar60._20_4_ * auVar36._20_4_;
          auVar14._24_4_ = auVar60._24_4_ * auVar36._24_4_;
          auVar14._28_4_ = auVar36._28_4_;
          pfVar2 = (float *)(uVar20 + 0x100 + (uVar30 ^ 0x20));
          pfVar1 = (float *)(uVar20 + 0x40 + (uVar30 ^ 0x20));
          auVar53._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar53._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar53._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar53._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar53._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar53._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar53._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar53._28_4_ = auVar54._28_4_ + pfVar1[7];
          auVar36 = vsubps_avx(auVar53,auVar58._0_32_);
          auVar18._4_4_ = auVar61._4_4_ * auVar36._4_4_;
          auVar18._0_4_ = auVar61._0_4_ * auVar36._0_4_;
          auVar18._8_4_ = auVar61._8_4_ * auVar36._8_4_;
          auVar18._12_4_ = auVar61._12_4_ * auVar36._12_4_;
          auVar18._16_4_ = auVar61._16_4_ * auVar36._16_4_;
          auVar18._20_4_ = auVar61._20_4_ * auVar36._20_4_;
          auVar18._24_4_ = auVar61._24_4_ * auVar36._24_4_;
          auVar18._28_4_ = auVar36._28_4_;
          auVar54 = ZEXT3264(auVar18);
          auVar13 = vminps_avx(auVar14,auVar18);
          auVar36 = vminps_avx(auVar33._0_32_,auVar17);
          auVar36 = vminps_avx(auVar36,auVar13);
          auVar36 = vcmpps_avx(auVar8,auVar36,2);
          if (((uint)uVar25 & 7) == 6) {
            auVar13 = vcmpps_avx(*(undefined1 (*) [32])(uVar20 + 0x1c0),auVar39,2);
            auVar14 = vcmpps_avx(auVar39,*(undefined1 (*) [32])(uVar20 + 0x1e0),1);
            auVar14 = vandps_avx(auVar13,auVar14);
            auVar36 = vandps_avx(auVar14,auVar36);
            auVar41 = vpackssdw_avx(auVar36._0_16_,auVar36._16_16_);
          }
          else {
            auVar41 = vpackssdw_avx(auVar36._0_16_,auVar36._16_16_);
          }
          auVar51 = ZEXT3264(auVar13);
          auVar41 = vpsllw_avx(auVar41,0xf);
          auVar45 = ZEXT1664(auVar41);
          local_24e0.valid = (int *)auVar8._0_8_;
          local_24e0.geometryUserPtr = (void *)auVar8._8_8_;
          local_24e0.primID = auVar8._16_4_;
          local_24e0._20_4_ = auVar8._20_4_;
          local_24e0.context = (RTCRayQueryContext *)auVar8._24_8_;
          if ((((((((auVar41 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar41 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar41 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar41 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar41[0xf]) {
            auVar41 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                             ((long)&(((RayHit *)local_24e0.rayhit)->super_RayK<1>).
                                                     dir.field_0 + 0xc),0));
            auVar37 = ZEXT1664(auVar41);
            if (pauVar19 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_014e29f5;
          }
          auVar41 = vpacksswb_avx(auVar41,auVar41);
          auVar37 = ZEXT1664(auVar41);
          bVar15 = SUB161(auVar41 >> 7,0) & 1 | (SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar41 >> 0x17,0) & 1) << 2 | (SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar41 >> 0x27,0) & 1) << 4 | (SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar41 >> 0x37,0) & 1) << 6 | SUB161(auVar41 >> 0x3f,0) << 7;
          lVar21 = 0;
          if (bVar15 != 0) {
            for (; (bVar15 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
            }
          }
          uVar25 = *(ulong *)(uVar20 + lVar21 * 8);
          uVar28 = bVar15 - 1 & (uint)bVar15;
          if (uVar28 != 0) {
            uVar6 = *(uint *)((long)&local_24e0.valid + lVar21 * 4);
            lVar21 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
            uVar23 = *(ulong *)(uVar20 + lVar21 * 8);
            uVar7 = *(uint *)((long)&local_24e0.valid + lVar21 * 4);
            uVar28 = uVar28 - 1 & uVar28;
            if (uVar28 == 0) {
              if (uVar6 < uVar7) {
                *(ulong *)*pauVar19 = uVar23;
                *(uint *)(*pauVar19 + 8) = uVar7;
                pauVar19 = pauVar19 + 1;
              }
              else {
                *(ulong *)*pauVar19 = uVar25;
                *(uint *)(*pauVar19 + 8) = uVar6;
                pauVar19 = pauVar19 + 1;
                uVar25 = uVar23;
              }
            }
            else {
              auVar34._8_8_ = 0;
              auVar34._0_8_ = uVar25;
              auVar41 = vpunpcklqdq_avx(auVar34,ZEXT416(uVar6));
              auVar38._8_8_ = 0;
              auVar38._0_8_ = uVar23;
              auVar34 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar7));
              lVar21 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                }
              }
              auVar42._8_8_ = 0;
              auVar42._0_8_ = *(ulong *)(uVar20 + lVar21 * 8);
              auVar46 = vpunpcklqdq_avx(auVar42,ZEXT416(*(uint *)((long)&local_24e0.valid +
                                                                 lVar21 * 4)));
              auVar45 = ZEXT1664(auVar46);
              uVar28 = uVar28 - 1 & uVar28;
              if (uVar28 == 0) {
                auVar40 = vpcmpgtd_avx(auVar34,auVar41);
                auVar52 = vpshufd_avx(auVar40,0xaa);
                auVar40 = vblendvps_avx(auVar34,auVar41,auVar52);
                auVar41 = vblendvps_avx(auVar41,auVar34,auVar52);
                auVar34 = vpcmpgtd_avx(auVar46,auVar40);
                auVar52 = vpshufd_avx(auVar34,0xaa);
                auVar34 = vblendvps_avx(auVar46,auVar40,auVar52);
                auVar51 = ZEXT1664(auVar34);
                auVar46 = vblendvps_avx(auVar40,auVar46,auVar52);
                auVar40 = vpcmpgtd_avx(auVar46,auVar41);
                auVar52 = vpshufd_avx(auVar40,0xaa);
                auVar45 = ZEXT1664(auVar52);
                auVar40 = vblendvps_avx(auVar46,auVar41,auVar52);
                auVar54 = ZEXT1664(auVar40);
                auVar41 = vblendvps_avx(auVar41,auVar46,auVar52);
                auVar37 = ZEXT1664(auVar41);
                *pauVar19 = auVar41;
                pauVar19[1] = auVar40;
                uVar25 = auVar34._0_8_;
                pauVar19 = pauVar19 + 2;
              }
              else {
                lVar21 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                  }
                }
                uVar6 = *(uint *)((long)&local_24e0.valid + lVar21 * 4);
                auVar54 = ZEXT464(uVar6);
                auVar48._8_8_ = 0;
                auVar48._0_8_ = *(ulong *)(uVar20 + lVar21 * 8);
                auVar40 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar6));
                auVar51 = ZEXT1664(auVar40);
                uVar28 = uVar28 - 1 & uVar28;
                uVar23 = (ulong)uVar28;
                if (uVar28 == 0) {
                  auVar52 = vpcmpgtd_avx(auVar34,auVar41);
                  auVar47 = vpshufd_avx(auVar52,0xaa);
                  auVar52 = vblendvps_avx(auVar34,auVar41,auVar47);
                  auVar41 = vblendvps_avx(auVar41,auVar34,auVar47);
                  auVar34 = vpcmpgtd_avx(auVar40,auVar46);
                  auVar47 = vpshufd_avx(auVar34,0xaa);
                  auVar34 = vblendvps_avx(auVar40,auVar46,auVar47);
                  auVar46 = vblendvps_avx(auVar46,auVar40,auVar47);
                  auVar40 = vpcmpgtd_avx(auVar46,auVar41);
                  auVar47 = vpshufd_avx(auVar40,0xaa);
                  auVar40 = vblendvps_avx(auVar46,auVar41,auVar47);
                  auVar51 = ZEXT1664(auVar40);
                  auVar41 = vblendvps_avx(auVar41,auVar46,auVar47);
                  auVar37 = ZEXT1664(auVar41);
                  auVar46 = vpcmpgtd_avx(auVar34,auVar52);
                  auVar47 = vpshufd_avx(auVar46,0xaa);
                  auVar46 = vblendvps_avx(auVar34,auVar52,auVar47);
                  auVar45 = ZEXT1664(auVar46);
                  auVar34 = vblendvps_avx(auVar52,auVar34,auVar47);
                  auVar52 = vpcmpgtd_avx(auVar40,auVar34);
                  auVar47 = vpshufd_avx(auVar52,0xaa);
                  auVar54 = ZEXT1664(auVar47);
                  auVar52 = vblendvps_avx(auVar40,auVar34,auVar47);
                  auVar34 = vblendvps_avx(auVar34,auVar40,auVar47);
                  *pauVar19 = auVar41;
                  pauVar19[1] = auVar34;
                  pauVar19[2] = auVar52;
                  uVar25 = auVar46._0_8_;
                  pauVar32 = pauVar19 + 3;
                }
                else {
                  *pauVar19 = auVar41;
                  pauVar19[1] = auVar34;
                  pauVar19[2] = auVar46;
                  pauVar19[3] = auVar40;
                  lVar21 = 0x30;
                  do {
                    lVar26 = lVar21;
                    lVar21 = 0;
                    if (uVar23 != 0) {
                      for (; (uVar23 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                      }
                    }
                    uVar25 = *(ulong *)(uVar20 + lVar21 * 8);
                    auVar35._8_8_ = 0;
                    auVar35._0_8_ = uVar25;
                    auVar41 = vpunpcklqdq_avx(auVar35,ZEXT416(*(uint *)((long)&local_24e0.valid +
                                                                       lVar21 * 4)));
                    auVar37 = ZEXT1664(auVar41);
                    *(undefined1 (*) [16])(pauVar19[1] + lVar26) = auVar41;
                    uVar23 = uVar23 & uVar23 - 1;
                    lVar21 = lVar26 + 0x10;
                  } while (uVar23 != 0);
                  pauVar32 = (undefined1 (*) [16])(pauVar19[1] + lVar26);
                  if (lVar26 + 0x10 != 0) {
                    lVar21 = 0x10;
                    pauVar24 = pauVar19;
                    do {
                      auVar41 = pauVar24[1];
                      auVar37 = ZEXT1664(auVar41);
                      pauVar24 = pauVar24 + 1;
                      uVar28 = vextractps_avx(auVar41,2);
                      lVar26 = lVar21;
                      do {
                        if (uVar28 <= *(uint *)(pauVar19[-1] + lVar26 + 8)) {
                          pauVar27 = (undefined1 (*) [16])(*pauVar19 + lVar26);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar19 + lVar26) =
                             *(undefined1 (*) [16])(pauVar19[-1] + lVar26);
                        lVar26 = lVar26 + -0x10;
                        pauVar27 = pauVar19;
                      } while (lVar26 != 0);
                      *pauVar27 = auVar41;
                      lVar21 = lVar21 + 0x10;
                    } while (pauVar32 != pauVar24);
                    uVar25 = *(ulong *)*pauVar32;
                  }
                }
                auVar56 = ZEXT3264(local_23c0);
                auVar57 = ZEXT3264(local_23e0);
                auVar58 = ZEXT3264(local_2400);
                auVar59 = ZEXT3264(local_2420);
                auVar60 = ZEXT3264(local_2440);
                auVar61 = ZEXT3264(local_2460);
                auVar55 = ZEXT3264(local_2480);
                pauVar19 = pauVar32;
              }
            }
          }
        }
        local_24f0 = (ulong)((uint)uVar25 & 0xf) - 8;
        if (local_24f0 != 0) {
          local_24f8 = local_2508->scene;
          local_24e8 = 0;
          do {
            local_24e0.geomID = *(uint *)((uVar25 & 0xfffffffffffffff0) + local_24e8 * 8);
            local_24b0 = (local_24f8->geometries).items[local_24e0.geomID].ptr;
            if (((((RayHit *)local_24e0.rayhit)->super_RayK<1>).mask & local_24b0->mask) != 0) {
              local_250c = 0xffffffff;
              local_24e0.geometryUserPtr = local_24b0->userPtr;
              local_24e0.valid = &local_250c;
              auVar41 = (undefined1  [16])local_24e0._0_16_;
              local_24e0.context = local_2508->user;
              local_24e0.N = 1;
              local_24e0.primID =
                   *(undefined4 *)((uVar25 & 0xfffffffffffffff0) + 4 + local_24e8 * 8);
              local_24e0._0_20_ = CONCAT416(local_24e0.primID,auVar41);
              local_24a8 = 0;
              local_24a0 = local_2508->args;
              pp_Var22 = (_func_int **)local_24a0->intersect;
              if (pp_Var22 == (_func_int **)0x0) {
                pp_Var22 = local_24b0[1].super_RefCount._vptr_RefCount;
              }
              auVar45 = ZEXT1664(auVar45._0_16_);
              auVar51 = ZEXT1664(auVar51._0_16_);
              auVar54 = ZEXT1664(auVar54._0_16_);
              (*(code *)pp_Var22)(&local_24e0);
              auVar56 = ZEXT3264(local_23c0);
              auVar57 = ZEXT3264(local_23e0);
              auVar58 = ZEXT3264(local_2400);
              auVar59 = ZEXT3264(local_2420);
              auVar60 = ZEXT3264(local_2440);
              auVar61 = ZEXT3264(local_2460);
              auVar55 = ZEXT3264(local_2480);
              local_24e0.rayhit = (RTCRayHitN *)local_2500;
            }
            local_24e8 = local_24e8 + 1;
          } while (local_24f0 != local_24e8);
        }
        fVar3 = (((RayHit *)local_24e0.rayhit)->super_RayK<1>).tfar;
        auVar33 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,CONCAT412
                                                  (fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))))))))
        ;
        auVar37 = ZEXT464((uint)(((RayHit *)local_24e0.rayhit)->super_RayK<1>).tfar);
      }
    } while (pauVar19 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }